

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::~PipelineStateBase
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  _Alloc_hider _Var1;
  string msg;
  string local_30;
  
  (this->
  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  ).super_ObjectBase<Diligent::IPipelineStateVk>.super_RefCountedObject<Diligent::IPipelineStateVk>.
  super_IPipelineStateVk.super_IPipelineState.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00935b28;
  if ((this->m_AsyncInitializer)._M_t.
      super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
      .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl ==
      (AsyncInitializer *)0x0) {
    local_30._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    AsyncInitializer::GetCompileTask((AsyncInitializer *)&local_30);
  }
  _Var1._M_p = local_30._M_dataplus._M_p;
  if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_30._M_dataplus._M_p + 0x10))(local_30._M_dataplus._M_p);
    if ((long *)_Var1._M_p != (long *)0x0) {
      FormatString<char[128]>
                (&local_30,
                 (char (*) [128])
                 "Initialize task is still running. This may result in a crash if the task accesses resources owned by the pipeline state object."
                );
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"~PipelineStateBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x1af);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (this->m_IsDestructed == false) {
    FormatString<char[58]>
              (&local_30,(char (*) [58])"This object must be explicitly destructed with Destruct()")
    ;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~PipelineStateBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1c2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
  ~unique_ptr(&this->m_AsyncInitializer);
  DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  ::~DeviceObjectBase(&this->
                       super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                     );
  return;
}

Assistant:

~PipelineStateBase()
    {
        VERIFY(!AsyncInitializer::GetAsyncTask(m_AsyncInitializer), "Initialize task is still running. This may result in a crash if the task accesses resources owned by the pipeline state object.");

        /*
        /// \note Destructor cannot directly remove the object from the registry as this may cause a
        ///       deadlock at the point where StateObjectsRegistry::Find() locks the weak pointer: if we
        ///       are in dtor, the object is locked by Diligent::RefCountedObject::Release() and
        ///       StateObjectsRegistry::Find() will wait for that lock to be released.
        ///       A the same time this thread will be waiting for the other thread to unlock the registry.\n
        ///       Thus destructor only notifies the registry that there is a deleted object.
        ///       The reference to the object will be removed later.
        auto &PipelineStateRegistry = static_cast<TRenderDeviceBase*>(this->GetDevice())->GetBSRegistry();
        auto &RasterizerStateRegistry = static_cast<TRenderDeviceBase*>(this->GetDevice())->GetRSRegistry();
        auto &DSSRegistry = static_cast<TRenderDeviceBase*>(this->GetDevice())->GetDSSRegistry();
        // StateObjectsRegistry::ReportDeletedObject() does not lock the registry, but only
        // atomically increments the outstanding deleted objects counter.
        PipelineStateRegistry.ReportDeletedObject();
        RasterizerStateRegistry.ReportDeletedObject();
        DSSRegistry.ReportDeletedObject();
        */
        VERIFY(m_IsDestructed, "This object must be explicitly destructed with Destruct()");
    }